

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O1

void __thiscall
perfetto::protos::gen::GpuCounterDescriptor_GpuCounterSpec::~GpuCounterDescriptor_GpuCounterSpec
          (GpuCounterDescriptor_GpuCounterSpec *this)

{
  pointer pcVar1;
  pointer pGVar2;
  pointer pGVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  
  (this->super_CppMessageObj)._vptr_CppMessageObj =
       (_func_int **)&PTR__GpuCounterDescriptor_GpuCounterSpec_003c6f28;
  pcVar1 = (this->unknown_fields_)._M_dataplus._M_p;
  paVar4 = &(this->unknown_fields_).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar4) {
    operator_delete(pcVar1,paVar4->_M_allocated_capacity + 1);
  }
  pGVar2 = (this->groups_).
           super__Vector_base<perfetto::protos::gen::GpuCounterDescriptor_GpuCounterGroup,_std::allocator<perfetto::protos::gen::GpuCounterDescriptor_GpuCounterGroup>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pGVar2 != (pointer)0x0) {
    operator_delete(pGVar2,(long)(this->groups_).
                                 super__Vector_base<perfetto::protos::gen::GpuCounterDescriptor_GpuCounterGroup,_std::allocator<perfetto::protos::gen::GpuCounterDescriptor_GpuCounterGroup>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pGVar2);
  }
  pGVar3 = (this->denominator_units_).
           super__Vector_base<perfetto::protos::gen::GpuCounterDescriptor_MeasureUnit,_std::allocator<perfetto::protos::gen::GpuCounterDescriptor_MeasureUnit>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pGVar3 != (pointer)0x0) {
    operator_delete(pGVar3,(long)(this->denominator_units_).
                                 super__Vector_base<perfetto::protos::gen::GpuCounterDescriptor_MeasureUnit,_std::allocator<perfetto::protos::gen::GpuCounterDescriptor_MeasureUnit>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pGVar3);
  }
  pGVar3 = (this->numerator_units_).
           super__Vector_base<perfetto::protos::gen::GpuCounterDescriptor_MeasureUnit,_std::allocator<perfetto::protos::gen::GpuCounterDescriptor_MeasureUnit>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pGVar3 != (pointer)0x0) {
    operator_delete(pGVar3,(long)(this->numerator_units_).
                                 super__Vector_base<perfetto::protos::gen::GpuCounterDescriptor_MeasureUnit,_std::allocator<perfetto::protos::gen::GpuCounterDescriptor_MeasureUnit>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pGVar3);
  }
  pcVar1 = (this->description_)._M_dataplus._M_p;
  paVar4 = &(this->description_).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar4) {
    operator_delete(pcVar1,paVar4->_M_allocated_capacity + 1);
  }
  pcVar1 = (this->name_)._M_dataplus._M_p;
  paVar4 = &(this->name_).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar4) {
    operator_delete(pcVar1,paVar4->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

GpuCounterDescriptor_GpuCounterSpec::~GpuCounterDescriptor_GpuCounterSpec() = default;